

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O0

void duckdb_je_malloc_stats_print(write_cb_t *write_cb,void *cbopaque,char *opts)

{
  long *in_FS_OFFSET;
  buf_writer_t buf_writer;
  tsdn_t *tsdn;
  tsd_t *tsd;
  buf_writer_t *in_stack_ffffffffffffff58;
  tsdn_t *in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  tsd_t *in_stack_ffffffffffffff70;
  buf_writer_t *in_stack_ffffffffffffff78;
  tsdn_t *in_stack_ffffffffffffff80;
  tsd_t *opts_00;
  tsd_t *in_stack_ffffffffffffffc8;
  tsd_t *in_stack_ffffffffffffffd0;
  
  if (duckdb_je_tsd_booted) {
    opts_00 = (tsd_t *)(*in_FS_OFFSET + -0x2a90);
    in_stack_ffffffffffffffc8 = opts_00;
    in_stack_ffffffffffffffd0 = opts_00;
    if (*(char *)(*in_FS_OFFSET + -0x2758) != '\0') {
      opts_00 = duckdb_je_tsd_fetch_slow(in_stack_ffffffffffffff70,(_Bool)in_stack_ffffffffffffff6f)
      ;
      in_stack_ffffffffffffffc8 = opts_00;
    }
  }
  else {
    opts_00 = (tsd_t *)0x0;
  }
  duckdb_je_buf_writer_init
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
             (write_cb_t *)in_stack_ffffffffffffff70,
             (void *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
             (char *)in_stack_ffffffffffffff60,(size_t)in_stack_ffffffffffffff58);
  duckdb_je_stats_print
            ((write_cb_t *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
             &opts_00->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled);
  duckdb_je_buf_writer_terminate(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  return;
}

Assistant:

JEMALLOC_NOTHROW
je_malloc_stats_print(void (*write_cb)(void *, const char *), void *cbopaque,
    const char *opts) {
	tsdn_t *tsdn;

	LOG("core.malloc_stats_print.entry", "");

	tsdn = tsdn_fetch();
	check_entry_exit_locking(tsdn);

	if (config_debug) {
		stats_print(write_cb, cbopaque, opts);
	} else {
		buf_writer_t buf_writer;
		buf_writer_init(tsdn, &buf_writer, write_cb, cbopaque, NULL,
		    STATS_PRINT_BUFSIZE);
		stats_print(buf_writer_cb, &buf_writer, opts);
		buf_writer_terminate(tsdn, &buf_writer);
	}

	check_entry_exit_locking(tsdn);
	LOG("core.malloc_stats_print.exit", "");
}